

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast2json.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  uchar *size;
  Errors *errors_00;
  pointer lexer_00;
  ulong uVar3;
  pointer pSVar4;
  pointer log_stream;
  reference this;
  pointer this_00;
  pointer line_finder_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view sVar5;
  string_view filename;
  string_view filename_00;
  string local_220;
  undefined1 local_200 [8];
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  FilenameMemoryStreamPair *pair;
  iterator __end3;
  iterator __begin3;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_> *__range3;
  string_view local_188;
  Enum local_178;
  allocator<char> local_171;
  undefined1 local_170 [16];
  string_view local_160;
  string local_150 [8];
  string output_basename;
  MemoryStream json_stream;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
  module_streams;
  string local_e0;
  Enum local_c0;
  Enum local_bc;
  undefined1 local_b6 [8];
  ValidateOptions options;
  undefined1 local_9b [8];
  WastParseOptions parse_wast_options;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_68;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  size_t local_40;
  Result local_34;
  undefined1 local_30 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,s_infile);
  sVar5._M_str = local_30;
  sVar5._M_len = local_40;
  local_34 = wabt::ReadFile((wabt *)errors.
                                    super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,sVar5,in_RCX);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&lexer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,s_infile);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  errors_00 = (Errors *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  filename_00._M_str = (char *)local_78._M_len;
  filename_00._M_len = (size_t)&local_68;
  wabt::WastLexer::CreateBufferLexer(filename_00,local_78._M_str,(size_t)size,errors_00);
  bVar1 = wabt::Failed(local_34);
  if (bVar1) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  std::unique_ptr<wabt::Script,std::default_delete<wabt::Script>>::
  unique_ptr<std::default_delete<wabt::Script>,void>
            ((unique_ptr<wabt::Script,std::default_delete<wabt::Script>> *)
             &parse_wast_options.features.annotations_enabled_);
  wabt::WastParseOptions::WastParseOptions((WastParseOptions *)local_9b,&s_features);
  lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get(&local_68)
  ;
  options.features._10_4_ =
       wabt::ParseWastScript
                 (lexer_00,(unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                           &parse_wast_options.features.annotations_enabled_,(Errors *)&lexer,
                  (WastParseOptions *)local_9b);
  options.features._14_4_ = options.features._10_4_;
  local_34 = (Result)options.features._10_4_;
  bVar1 = wabt::Succeeded((Result)options.features._10_4_);
  if ((bVar1) && ((s_validate & 1U) != 0)) {
    wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_b6,&s_features);
    pSVar4 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get
                       ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                        &parse_wast_options.features.annotations_enabled_);
    local_bc = (Enum)wabt::ValidateScript(pSVar4,(Errors *)&lexer,(ValidateOptions *)local_b6);
    local_34 = (Result)local_bc;
  }
  local_c0 = local_34.enum_;
  bVar1 = wabt::Succeeded(local_34);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &module_streams.
                  super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,s_infile);
      DefaultOuputName_abi_cxx11_(&local_e0,stack0xffffffffffffff10);
      std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    vector((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
            *)&json_stream.buf_);
    wabt::MemoryStream::MemoryStream
              ((MemoryStream *)((long)&output_basename.field_2 + 8),(Stream *)0x0);
    local_170 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&s_outfile_abi_cxx11_);
    filename._M_str = local_170._8_8_;
    filename._M_len = (size_t)filename._M_str;
    local_160 = wabt::StripExtension(local_170._0_8_,filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_150,&local_160,&local_171);
    std::allocator<char>::~allocator(&local_171);
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.function_references_enabled_ =
         s_features.function_references_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    s_write_binary_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    s_write_binary_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    pSVar4 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get
                       ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                        &parse_wast_options.features.annotations_enabled_);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,s_infile);
    sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_150);
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    local_178 = (Enum)wabt::WriteBinarySpecScript
                                ((Stream *)((long)&output_basename.field_2 + 8),pSVar4,local_188,
                                 sVar5,&s_write_binary_options,
                                 (vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                                  *)&json_stream.buf_,&log_stream->super_Stream);
    local_34 = (Result)local_178;
    bVar1 = wabt::Succeeded((Result)local_178);
    if (bVar1) {
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&s_outfile_abi_cxx11_);
      local_34 = wabt::MemoryStream::WriteToFile
                           ((MemoryStream *)((long)&output_basename.field_2 + 8),sVar5);
    }
    bVar1 = wabt::Succeeded(local_34);
    if (bVar1) {
      __end3 = std::
               vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
               ::begin((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                        *)&json_stream.buf_);
      pair = (FilenameMemoryStreamPair *)
             std::
             vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
             ::end((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                    *)&json_stream.buf_);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
                                    *)&pair);
        if (!bVar1) break;
        this = __gnu_cxx::
               __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
               ::operator*(&__end3);
        this_00 = std::unique_ptr<wabt::MemoryStream,_std::default_delete<wabt::MemoryStream>_>::
                  operator->(&this->stream);
        sVar5 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
        line_finder._M_t.
        super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
        .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._4_4_ =
             wabt::MemoryStream::WriteToFile(this_00,sVar5);
        local_34 = line_finder._M_t.
                   super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                   .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._4_4_;
        bVar1 = wabt::Succeeded(line_finder._M_t.
                                super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                                .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>.
                                _M_head_impl._4_4_);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
        ::operator++(&__end3);
      }
    }
    std::__cxx11::string::~string(local_150);
    wabt::MemoryStream::~MemoryStream((MemoryStream *)((long)&output_basename.field_2 + 8));
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    ~vector((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
             *)&json_stream.buf_);
  }
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::operator->(&local_68);
  wabt::WastLexer::MakeLineFinder((WastLexer *)local_200);
  line_finder_00 =
       std::
       unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
       get((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
            *)local_200);
  file = _stderr;
  std::__cxx11::string::string((string *)&local_220);
  wabt::FormatErrorsToFile((Errors *)&lexer,Text,line_finder_00,(FILE *)file,&local_220,Never,0x50);
  std::__cxx11::string::~string((string *)&local_220);
  EVar2 = wabt::Result::operator_cast_to_Enum(&local_34);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
               *)local_200);
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr
            ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
             &parse_wast_options.features.annotations_enabled_);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_68);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&lexer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size(), &errors);
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  std::unique_ptr<Script> script;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWastScript(lexer.get(), &script, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateScript(script.get(), &errors, options);
  }

  if (Succeeded(result)) {
    if (s_outfile.empty()) {
      s_outfile = DefaultOuputName(s_infile);
    }

    std::vector<FilenameMemoryStreamPair> module_streams;
    MemoryStream json_stream;

    std::string output_basename(StripExtension(s_outfile));
    s_write_binary_options.features = s_features;
    result = WriteBinarySpecScript(&json_stream, script.get(), s_infile,
                                   output_basename, s_write_binary_options,
                                   &module_streams, s_log_stream.get());

    if (Succeeded(result)) {
      result = json_stream.WriteToFile(s_outfile);
    }

    if (Succeeded(result)) {
      for (const auto& pair : module_streams) {
        result = pair.stream->WriteToFile(pair.filename);
        if (!Succeeded(result)) {
          break;
        }
      }
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}